

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTags(Config *config)

{
  bool bVar1;
  _Setw _Var2;
  ulong uVar3;
  ostream *poVar4;
  Column *pCVar5;
  size_t newIndent;
  ostream *poVar6;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *this;
  ostream *this_00;
  size_type sVar7;
  long *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_TagInfo>_>::value,_pair<iterator,_bool>_>
  _Var8;
  Column wrapper;
  string str;
  ReusableStringStream rss;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
  *tagCount;
  iterator __end1_1;
  iterator __begin1_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  *__range1_1;
  iterator countIt;
  string lcaseTagName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *tagName;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  TestCase *testCase;
  iterator __end1;
  iterator __begin1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range1;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  tagCounts;
  TestSpec *testSpec;
  Column *in_stack_fffffffffffffc98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
  *in_stack_fffffffffffffca0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
  *in_stack_fffffffffffffca8;
  TagInfo *in_stack_fffffffffffffcb0;
  string *in_stack_fffffffffffffcb8;
  allocator *paVar9;
  ReusableStringStream *in_stack_fffffffffffffcd0;
  IConfig *in_stack_fffffffffffffce8;
  TestSpec *in_stack_fffffffffffffcf0;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd08;
  TestCaseInfo *in_stack_fffffffffffffd38;
  allocator local_2b1;
  string local_2b0 [72];
  string local_268 [32];
  Column local_248 [2];
  string local_1e8 [36];
  int local_1c4;
  reference local_1a8;
  _Self local_1a0;
  _Self local_198;
  undefined1 *local_190;
  _Base_ptr local_188;
  undefined1 local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  _Base_ptr local_e8;
  undefined1 local_e0;
  _Self local_d8;
  _Self local_d0;
  string local_c8 [32];
  reference local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  reference local_88;
  TestCase *local_80;
  __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_78;
  undefined1 *local_70;
  undefined1 local_58 [24];
  undefined1 local_40 [48];
  undefined8 local_10;
  long *local_8;
  
  local_8 = in_RDI;
  local_10 = (**(code **)(*in_RDI + 0x68))();
  uVar3 = (**(code **)(*local_8 + 0x70))();
  if ((uVar3 & 1) == 0) {
    poVar4 = cout();
    std::operator<<((ostream *)poVar4,"All available tags:\n");
  }
  else {
    poVar4 = cout();
    std::operator<<((ostream *)poVar4,"Tags for matching test cases:\n");
  }
  clara::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
         *)0x138fb0);
  poVar4 = (ostream *)getAllTestCasesSorted((IConfig *)0x138fbd);
  filterTests(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
  local_70 = local_58;
  local_78._M_current =
       (TestCase *)
       clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                  in_stack_fffffffffffffc98);
  local_80 = (TestCase *)
             clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                       ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
                        in_stack_fffffffffffffc98);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffca0,
                            (__normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_fffffffffffffc98), bVar1) {
    local_88 = __gnu_cxx::
               __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator*(&local_78);
    in_stack_fffffffffffffd38 = TestCase::getTestCaseInfo(local_88);
    local_90 = &in_stack_fffffffffffffd38->tags;
    local_98._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         clara::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&in_stack_fffffffffffffc98->m_strings);
    local_a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               clara::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&in_stack_fffffffffffffc98->m_strings);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffca0,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffc98), bVar1) {
      local_a8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_98);
      toLower(in_stack_fffffffffffffcb8);
      local_d0._M_node =
           (_Base_ptr)
           clara::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
           ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                   *)in_stack_fffffffffffffc98,(key_type *)0x13910f);
      local_d8._M_node =
           (_Base_ptr)
           clara::std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
           ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                  *)in_stack_fffffffffffffc98);
      bVar1 = clara::std::operator==(&local_d0,&local_d8);
      if (bVar1) {
        local_158 = 0;
        uStack_150 = 0;
        local_168 = 0;
        uStack_160 = 0;
        local_178 = 0;
        uStack_170 = 0;
        local_148 = 0;
        TagInfo::TagInfo((TagInfo *)in_stack_fffffffffffffca0);
        std::make_pair<std::__cxx11::string&,Catch::TagInfo>
                  (&in_stack_fffffffffffffca8->first,(TagInfo *)in_stack_fffffffffffffca0);
        _Var8 = std::
                map<std::__cxx11::string,Catch::TagInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                ::insert<std::pair<std::__cxx11::string,Catch::TagInfo>>
                          ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                            *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        local_188 = (_Base_ptr)_Var8.first._M_node;
        local_180 = _Var8.second;
        local_e8 = local_188;
        local_e0 = local_180;
        local_d0._M_node = local_188;
        clara::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
        ::~pair(in_stack_fffffffffffffca0);
        TagInfo::~TagInfo((TagInfo *)0x139243);
      }
      clara::std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
      ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
                    *)0x1392e6);
      TagInfo::add(in_stack_fffffffffffffcb0,&in_stack_fffffffffffffca8->first);
      std::__cxx11::string::~string(local_c8);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_98);
    }
    __gnu_cxx::
    __normal_iterator<Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_78);
  }
  local_190 = local_40;
  local_198._M_node =
       (_Base_ptr)
       clara::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                *)in_stack_fffffffffffffc98);
  local_1a0._M_node =
       (_Base_ptr)
       clara::std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
              *)in_stack_fffffffffffffc98);
  while (bVar1 = clara::std::operator!=(&local_198,&local_1a0), bVar1) {
    local_1a8 = clara::std::
                _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
                ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
                             *)0x1393a6);
    ReusableStringStream::ReusableStringStream(in_stack_fffffffffffffcd0);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffca0,
               (char (*) [3])in_stack_fffffffffffffc98);
    _Var2 = clara::std::setw(2);
    local_1c4 = _Var2._M_n;
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffcb0,(_Setw *)in_stack_fffffffffffffca8)
    ;
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffca0,
               (unsigned_long *)in_stack_fffffffffffffc98);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffca0,
               (char (*) [3])in_stack_fffffffffffffc98);
    ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffc98);
    TagInfo::all_abi_cxx11_((TagInfo *)CONCAT44(_Var2._M_n,in_stack_fffffffffffffd08));
    clara::TextFlow::Column::Column
              ((Column *)in_stack_fffffffffffffcb0,&in_stack_fffffffffffffca8->first);
    pCVar5 = clara::TextFlow::Column::initialIndent(local_248,0);
    newIndent = std::__cxx11::string::size();
    pCVar5 = clara::TextFlow::Column::indent(pCVar5,newIndent);
    pCVar5 = clara::TextFlow::Column::width(pCVar5,0x46);
    clara::TextFlow::Column::Column((Column *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98);
    clara::TextFlow::Column::~Column((Column *)0x1394f5);
    std::__cxx11::string::~string(local_268);
    poVar6 = cout();
    in_stack_fffffffffffffcd0 = (ReusableStringStream *)std::operator<<((ostream *)poVar6,local_1e8)
    ;
    poVar6 = clara::TextFlow::operator<<(poVar4,(Column *)in_stack_fffffffffffffd38);
    std::operator<<((ostream *)poVar6,'\n');
    clara::TextFlow::Column::~Column((Column *)0x13955e);
    std::__cxx11::string::~string(local_1e8);
    ReusableStringStream::~ReusableStringStream((ReusableStringStream *)pCVar5);
    clara::std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>
                  *)in_stack_fffffffffffffca0);
  }
  cout();
  this = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
         clara::std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
         ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                 *)0x139658);
  paVar9 = &local_2b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"tag",paVar9);
  pluralise::pluralise
            ((pluralise *)in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98,
             (string *)0x1396a4);
  poVar4 = operator<<((ostream *)in_stack_fffffffffffffca0,(pluralise *)in_stack_fffffffffffffc98);
  this_00 = std::operator<<((ostream *)poVar4,'\n');
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  pluralise::~pluralise((pluralise *)0x1396f5);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  sVar7 = clara::std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                  *)0x13971c);
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(this);
  clara::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
          *)0x13973a);
  return sVar7;
}

Assistant:

std::size_t listTags( Config const& config ) {
        TestSpec const& testSpec = config.testSpec();
        if( config.hasTestFilters() )
            Catch::cout() << "Tags for matching test cases:\n";
        else {
            Catch::cout() << "All available tags:\n";
        }

        std::map<std::string, TagInfo> tagCounts;

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( auto const& testCase : matchedTestCases ) {
            for( auto const& tagName : testCase.getTestCaseInfo().tags ) {
                std::string lcaseTagName = toLower( tagName );
                auto countIt = tagCounts.find( lcaseTagName );
                if( countIt == tagCounts.end() )
                    countIt = tagCounts.insert( std::make_pair( lcaseTagName, TagInfo() ) ).first;
                countIt->second.add( tagName );
            }
        }

        for( auto const& tagCount : tagCounts ) {
            ReusableStringStream rss;
            rss << "  " << std::setw(2) << tagCount.second.count << "  ";
            auto str = rss.str();
            auto wrapper = Column( tagCount.second.all() )
                                                    .initialIndent( 0 )
                                                    .indent( str.size() )
                                                    .width( CATCH_CONFIG_CONSOLE_WIDTH-10 );
            Catch::cout() << str << wrapper << '\n';
        }
        Catch::cout() << pluralise( tagCounts.size(), "tag" ) << '\n' << std::endl;
        return tagCounts.size();
    }